

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact.hpp
# Opt level: O2

basic_variable<std::allocator<char>_> *
trial::protocol::json::detail::compact<trial::dynamic::basic_variable<std::allocator<char>>>
          (intmax_t value)

{
  basic_variable<std::allocator<char>_> *in_RDI;
  
  if ((char)(uchar)value == value) {
    (in_RDI->storage).current = '\x02';
    (in_RDI->storage).storage.__data[0] = (uchar)value;
    return in_RDI;
  }
  if ((short)value != value) {
    if ((int)value != value) {
      (in_RDI->storage).current = '\b';
      *(intmax_t *)&(in_RDI->storage).storage = value;
      return in_RDI;
    }
    (in_RDI->storage).current = '\x06';
    *(int *)&(in_RDI->storage).storage = (int)value;
    return in_RDI;
  }
  (in_RDI->storage).current = '\x04';
  *(short *)&(in_RDI->storage).storage = (short)value;
  return in_RDI;
}

Assistant:

auto compact(std::intmax_t value) -> ReturnType
{
    if ((value <= std::numeric_limits<signed char>::max()) &&
        (value >= std::numeric_limits<signed char>::min()))
        return static_cast<signed char>(value);
    if ((value <= std::numeric_limits<signed short int>::max()) &&
        (value >= std::numeric_limits<signed short int>::min()))
        return static_cast<signed short int>(value);
    if ((value <= std::numeric_limits<signed int>::max()) &&
        (value >= std::numeric_limits<signed int>::min()))
        return static_cast<signed int>(value);
    if ((value <= std::numeric_limits<signed long int>::max()) &&
        (value >= std::numeric_limits<signed long int>::min()))
        return static_cast<signed long int>(value);
    return value;
}